

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

Aig_Man_t * Aig_ManSclPart(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  Vec_Int_t *vPart;
  undefined8 uVar3;
  uint uVar4;
  Vec_Ptr_t *__ptr;
  void **ppvVar5;
  Vec_Vec_t *pVVar6;
  int *piVar7;
  void *__dest;
  Aig_Man_t *pAVar8;
  undefined4 in_register_0000000c;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int nCountPis;
  int *pMapBack;
  int local_54;
  int local_50;
  int nCountRegs;
  Aig_Man_t *local_48;
  undefined8 local_40;
  Aig_Man_t *local_38;
  
  local_40 = CONCAT44(in_register_0000000c,fVerbose);
  local_54 = fLatchConst;
  local_50 = fLatchEqual;
  if (pAig->vClockDoms == (Vec_Vec_t *)0x0) {
    __ptr = Aig_ManRegPartitionSimple(pAig,0,0);
  }
  else {
    __ptr = (Vec_Ptr_t *)malloc(0x10);
    __ptr->nCap = 100;
    __ptr->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    __ptr->pArray = ppvVar5;
    pVVar6 = pAig->vClockDoms;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pvVar2 = pVVar6->pArray[lVar9];
        piVar7 = (int *)malloc(0x10);
        iVar11 = *(int *)((long)pvVar2 + 4);
        lVar12 = (long)iVar11;
        piVar7[1] = iVar11;
        *piVar7 = iVar11;
        if (lVar12 == 0) {
          __dest = (void *)0x0;
        }
        else {
          __dest = malloc(lVar12 * 4);
        }
        *(void **)(piVar7 + 2) = __dest;
        memcpy(__dest,*(void **)((long)pvVar2 + 8),lVar12 << 2);
        uVar4 = __ptr->nCap;
        if (__ptr->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (__ptr->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(__ptr->pArray,0x80);
            }
            iVar11 = 0x10;
          }
          else {
            iVar11 = uVar4 * 2;
            if (iVar11 <= (int)uVar4) goto LAB_0063f533;
            if (__ptr->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(__ptr->pArray,(ulong)uVar4 << 4);
            }
          }
          __ptr->pArray = ppvVar5;
          __ptr->nCap = iVar11;
        }
LAB_0063f533:
        iVar11 = __ptr->nSize;
        __ptr->nSize = iVar11 + 1;
        __ptr->pArray[iVar11] = piVar7;
        lVar9 = lVar9 + 1;
        pVVar6 = pAig->vClockDoms;
      } while (lVar9 < pVVar6->nSize);
    }
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  uVar3 = local_40;
  if (0 < __ptr->nSize) {
    uVar10 = 0;
    local_48 = pAig;
    do {
      vPart = (Vec_Int_t *)__ptr->pArray[uVar10];
      pAVar8 = Aig_ManRegCreatePart(pAig,vPart,&nCountPis,&nCountRegs,&pMapBack);
      Aig_ManSetRegNum(pAVar8,pAVar8->nRegs);
      if (0 < nCountPis) {
        local_38 = Aig_ManScl(pAVar8,local_54,local_50,0,-1,-1,(int)uVar3,0);
        uVar4 = Aig_TransferMappedClasses(pAig,pAVar8,pMapBack);
        if ((int)uVar3 != 0) {
          uVar1 = vPart->nSize;
          printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n"
                 ,uVar10 & 0xffffffff,(ulong)uVar1,(ulong)(pAVar8->nObjs[2] - uVar1),
                 (ulong)(uint)nCountPis,(ulong)(uint)nCountRegs,
                 (ulong)(uint)(pAVar8->nObjs[6] + pAVar8->nObjs[5]),0,(ulong)uVar4);
        }
        Aig_ManStop(local_38);
        pAig = local_48;
      }
      Aig_ManStop(pAVar8);
      if (pMapBack != (int *)0x0) {
        free(pMapBack);
        pMapBack = (int *)0x0;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)__ptr->nSize);
  }
  pAVar8 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar8);
  if (0 < __ptr->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar9];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return pAVar8;
}

Assistant:

Aig_Man_t * Aig_ManSclPart( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fVerbose ) 
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, nCountPis, nCountRegs;
    int * pMapBack;
    Aig_Man_t * pTemp, * pNew;
    int nClasses;

    if ( pAig->vClockDoms ) 
    {
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
            Vec_PtrPush( vResult, Vec_IntDup(vPart) );
    } 
    else
        vResult = Aig_ManRegPartitionSimple( pAig, 0, 0 );

    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i ) 
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        Aig_ManSetRegNum( pTemp, pTemp->nRegs );
        if (nCountPis>0) 
        {
            pNew = Aig_ManScl( pTemp, fLatchConst, fLatchEqual, 0, -1, -1, fVerbose, 0 );
            nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
            if ( fVerbose )
                printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n",
                        i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), 0, nClasses );
            Aig_ManStop( pNew );
        }
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
    Vec_VecFree( (Vec_Vec_t*)vResult );
    return pNew;
}